

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregationValidator.h
# Opt level: O0

void __thiscall
jaegertracing::thrift::AggregationValidatorProcessor::~AggregationValidatorProcessor
          (AggregationValidatorProcessor *this)

{
  AggregationValidatorProcessor *this_local;
  
  (this->super_TDispatchProcessor).super_TProcessor._vptr_TProcessor =
       (_func_int **)&PTR__AggregationValidatorProcessor_004fbb28;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(jaegertracing::thrift::AggregationValidatorProcessor::*)(int,_apache::thrift::protocol::TProtocol_*,_apache::thrift::protocol::TProtocol_*,_void_*),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(jaegertracing::thrift::AggregationValidatorProcessor::*)(int,_apache::thrift::protocol::TProtocol_*,_apache::thrift::protocol::TProtocol_*,_void_*)>_>_>
  ::~map(&this->processMap_);
  std::shared_ptr<jaegertracing::thrift::AggregationValidatorIf>::~shared_ptr(&this->iface_);
  apache::thrift::TDispatchProcessor::~TDispatchProcessor(&this->super_TDispatchProcessor);
  return;
}

Assistant:

virtual ~AggregationValidatorProcessor() {}